

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitTableGrow(BinaryInstWriter *this,TableGrow *curr)

{
  U32LEB x;
  BufferWithRandomAccess *pBVar1;
  
  pBVar1 = BufferWithRandomAccess::operator<<(this->o,-4);
  BufferWithRandomAccess::operator<<(pBVar1,(U32LEB)0xf);
  pBVar1 = this->o;
  x.value = WasmBinaryWriter::getTableIndex(this->parent,(Name)(curr->table).super_IString.str);
  BufferWithRandomAccess::operator<<(pBVar1,x);
  return;
}

Assistant:

void BinaryInstWriter::visitTableGrow(TableGrow* curr) {
  o << int8_t(BinaryConsts::MiscPrefix) << U32LEB(BinaryConsts::TableGrow);
  o << U32LEB(parent.getTableIndex(curr->table));
}